

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_merge_sort_in_place_frontmerge(int64_t *dst1,size_t l1,int64_t *dst2,size_t l2)

{
  long lVar1;
  long in_RCX;
  long *in_RDX;
  size_t in_RSI;
  int64_t *in_RDI;
  int64_t _sort_swap_temp_2;
  int64_t _sort_swap_temp_1;
  int64_t _sort_swap_temp;
  int64_t *dst0;
  long *local_28;
  long local_20;
  long *local_18;
  size_t local_10;
  long *local_8;
  
  local_28 = in_RDX + -in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = in_RDX;
  local_20 = in_RCX;
  if (in_RDI[in_RSI - 1] - *in_RDX < 1) {
    sorter_merge_sort_in_place_aswap(in_RDI,local_28,in_RSI);
  }
  else {
    do {
      while (*local_18 - *local_8 < 1) {
        lVar1 = *local_18;
        *local_18 = *local_28;
        *local_28 = lVar1;
        local_18 = local_18 + 1;
        local_28 = local_28 + 1;
        local_20 = local_20 + -1;
        if (local_20 == 0) {
          do {
            lVar1 = *local_8;
            *local_8 = *local_28;
            *local_28 = lVar1;
            local_8 = local_8 + 1;
            local_28 = local_28 + 1;
            local_10 = local_10 - 1;
          } while (local_10 != 0);
          return;
        }
      }
      lVar1 = *local_8;
      *local_8 = *local_28;
      *local_28 = lVar1;
      local_8 = local_8 + 1;
      local_28 = local_28 + 1;
      local_10 = local_10 - 1;
    } while (local_10 != 0);
  }
  return;
}

Assistant:

void MERGE_SORT_IN_PLACE_FRONTMERGE(SORT_TYPE *dst1, size_t l1, SORT_TYPE *dst2,
                                    size_t l2) {
  SORT_TYPE *dst0 = dst2 - l1;

  if (SORT_CMP(dst1[l1 - 1], dst2[0]) <= 0) {
    MERGE_SORT_IN_PLACE_ASWAP(dst1, dst0, l1);
    return;
  }

  do {
    while (SORT_CMP(*dst2, *dst1) > 0) {
      SORT_SWAP(*dst1, *dst0);
      dst1++;
      dst0++;

      if (--l1 == 0) {
        return;
      }
    }

    SORT_SWAP(*dst2, *dst0);
    dst2++;
    dst0++;
  } while (--l2);

  do {
    SORT_SWAP(*dst1, *dst0);
    dst1++;
    dst0++;
  } while (--l1);
}